

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O3

void __thiscall
SMBusSignalState::AddMarkers
          (SMBusSignalState *this,AnalyzerResults *pResults,Channel *chnlSMBCLK,Channel *chnlSMBDAT)

{
  SMBusSignal SVar1;
  Channel *pCVar2;
  MarkerType MVar3;
  
  SVar1 = this->bus_signal;
  if (SVar1 - SMB_Zero < 4) {
    AnalyzerResults::AddMarker
              ((ulonglong)pResults,(MarkerType)this->sample_rising_clk,(Channel *)0x4);
    switch(this->bus_signal) {
    case SMB_Zero:
      MVar3 = (MarkerType)this->sample_marker;
      pCVar2 = (Channel *)0xb;
      break;
    case SMB_One:
      MVar3 = (MarkerType)this->sample_marker;
      pCVar2 = (Channel *)0xa;
      break;
    case SMB_ACK:
      MVar3 = (MarkerType)this->sample_marker;
      pCVar2 = (Channel *)0x0;
      break;
    case SMB_NACK:
      MVar3 = (MarkerType)this->sample_marker;
      pCVar2 = (Channel *)0x1;
      break;
    default:
      return;
    }
  }
  else {
    if (SMB_Stop < SVar1) {
      return;
    }
    MVar3 = (MarkerType)this->sample_marker;
    pCVar2 = (Channel *)(ulong)(SVar1 == SMB_Stop | 8);
  }
  AnalyzerResults::AddMarker((ulonglong)pResults,MVar3,pCVar2);
  return;
}

Assistant:

void SMBusSignalState::AddMarkers( AnalyzerResults* pResults, Channel& chnlSMBCLK, Channel& chnlSMBDAT )
{
    if( bus_signal == SMB_Zero || bus_signal == SMB_One || bus_signal == SMB_ACK || bus_signal == SMB_NACK )
    {
        pResults->AddMarker( sample_rising_clk, AnalyzerResults::UpArrow, chnlSMBCLK );

        if( bus_signal == SMB_Zero )
            pResults->AddMarker( sample_marker, AnalyzerResults::Zero, chnlSMBDAT );
        else if( bus_signal == SMB_One )
            pResults->AddMarker( sample_marker, AnalyzerResults::One, chnlSMBDAT );
        else if( bus_signal == SMB_ACK )
            pResults->AddMarker( sample_marker, AnalyzerResults::Dot, chnlSMBDAT );
        else if( bus_signal == SMB_NACK )
            pResults->AddMarker( sample_marker, AnalyzerResults::ErrorDot, chnlSMBDAT );
    }
    else if( bus_signal == SMB_Start || bus_signal == SMB_Stop )
    {
        pResults->AddMarker( sample_marker, bus_signal == SMB_Stop ? AnalyzerResults::Stop : AnalyzerResults::Start, chnlSMBDAT );
    }
}